

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_compare(sexp ctx,sexp a,sexp b)

{
  double dVar1;
  char cVar2;
  sexp_tag_t sVar3;
  sexp *ppsVar4;
  sexp *ppsVar5;
  uint uVar6;
  sexp psVar7;
  sexp_sint_t sVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  char *msg;
  long lVar12;
  double dVar13;
  sexp tmp;
  sexp local_38;
  sexp_gc_var_t local_30;
  
  local_30.var = &local_38;
  if (((ulong)a & 3) == 0) {
    uVar6 = 0;
    if ((ulong)a->tag < 0x11) {
      uVar6 = sexp_number_types[a->tag];
    }
  }
  else {
    uVar6 = (uint)a & 1;
  }
  if (((ulong)b & 3) == 0) {
    uVar11 = 0;
    if ((ulong)b->tag < 0x11) {
      uVar11 = sexp_number_types[b->tag];
    }
  }
  else {
    uVar11 = (uint)b & 1;
  }
  local_38 = (sexp)&DAT_0000043e;
  local_30.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  if ((int)uVar11 < (int)uVar6) {
    local_30.var = &local_38;
    psVar7 = sexp_compare(ctx,b,a);
    if (((ulong)psVar7 & 3) == 0) {
      sVar3 = psVar7->tag;
      if (sVar3 == 0x13) goto LAB_0011bd88;
      if (sVar3 == 0xc) {
        (psVar7->value).flonum_bits[0] = -(psVar7->value).flonum_bits[0];
        goto LAB_0011bd88;
      }
      if (sVar3 == 0xb) {
        (psVar7->value).stack.length = (psVar7->value).stack.length ^ 0x8000000000000000;
        goto LAB_0011bd88;
      }
    }
    if (((ulong)psVar7 & 1) != 0) {
      psVar7 = (sexp)(1 - ((ulong)psVar7 & 0xfffffffffffffffe));
    }
    goto LAB_0011bd88;
  }
  ppsVar4 = &local_38;
  ppsVar5 = &local_38;
  switch(uVar11 + uVar6 * 6) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 0xb:
  case 0x11:
  case 0x17:
  case 0x1d:
  case 0x23:
    local_30.var = &local_38;
    psVar7 = sexp_type_exception(ctx,(sexp)0x0,3,a);
    goto LAB_0011bd88;
  default:
    msg = "unknown comparison";
    b = a;
    break;
  case 7:
    lVar12 = -((ulong)b & 0xfffffffffffffffe);
LAB_0011bda9:
    psVar7 = (sexp)((long)&a->tag + lVar12 | 1);
    goto LAB_0011bd88;
  case 8:
    dVar13 = (b->value).flonum;
    if (ABS(dVar13) == INFINITY) {
      uVar10 = (ulong)(dVar13 <= 0.0);
      goto LAB_0011bce0;
    }
    if (!NAN(dVar13)) {
      local_30.var = &local_38;
      b = sexp_inexact_to_exact(ctx,(sexp)0x0,1,b);
      local_38 = b;
LAB_0011bd80:
      psVar7 = sexp_compare(ctx,a,b);
      goto LAB_0011bd88;
    }
LAB_0011bdbb:
    msg = "can\'t compare NaN";
    break;
  case 9:
    uVar10 = (b->value).string.offset;
    do {
      uVar9 = uVar10;
      if (uVar9 == 1) goto LAB_0011bc48;
      uVar10 = uVar9 - 1;
    } while (*(long *)((long)&b->value + uVar9 * 8 + 8) == 0);
    if (uVar9 < 2) {
LAB_0011bc48:
      uVar10 = (b->value).string.length;
      if (uVar10 >> 0x3e == 0) {
        lVar12 = uVar10 * -2;
        goto LAB_0011bda9;
      }
    }
    uVar10 = (ulong)((b->value).flonum_bits[0] < '\0');
    goto LAB_0011bce0;
  case 10:
  case 0x16:
    local_30.var = &local_38;
    a = sexp_make_ratio(ctx,a,(sexp)&DAT_00000003);
    local_38 = a;
    ppsVar5 = local_30.var;
  case 0x1c:
    local_30.var = ppsVar5;
    psVar7 = sexp_ratio_compare(ctx,a,b);
    goto LAB_0011bd88;
  case 0xe:
    dVar13 = (a->value).flonum;
    if (!NAN(dVar13)) {
      dVar1 = (b->value).flonum;
      if (!NAN(dVar1)) {
        psVar7 = (sexp)&DAT_ffffffffffffffff;
        if (dVar1 <= dVar13) {
          psVar7 = (sexp)((ulong)(-(uint)(dVar13 != dVar1) & 1) * 2 + 1);
        }
        goto LAB_0011bd88;
      }
      goto LAB_0011bdbb;
    }
    goto LAB_0011bdaf;
  case 0xf:
    dVar13 = (a->value).flonum;
    if (ABS(dVar13) != INFINITY) {
      if (NAN(dVar13)) goto LAB_0011bdaf;
      local_30.var = &local_38;
      a = sexp_double_to_bignum(ctx,dVar13);
      local_38 = a;
      ppsVar4 = local_30.var;
      goto switchD_0011bb30_caseD_15;
    }
LAB_0011bc88:
    uVar10 = (ulong)(0.0 < dVar13);
LAB_0011bce0:
    psVar7 = (sexp)(uVar10 * 4 + -1);
    goto LAB_0011bd88;
  case 0x10:
    dVar13 = (a->value).flonum;
    if (ABS(dVar13) == INFINITY) goto LAB_0011bc88;
    if (!NAN(dVar13)) {
      a = sexp_inexact_to_exact(ctx,(sexp)0x0,1,a);
      local_38 = a;
      goto LAB_0011bd80;
    }
LAB_0011bdaf:
    msg = "can\'t compare NaN";
    b = a;
    break;
  case 0x15:
switchD_0011bb30_caseD_15:
    local_30.var = ppsVar4;
    cVar2 = (a->value).flonum_bits[0];
    lVar12 = (long)cVar2;
    if (cVar2 == (b->value).flonum_bits[0]) {
      sVar8 = sexp_bignum_compare_abs(a,b);
      lVar12 = -sVar8;
      if (-1 < cVar2) {
        lVar12 = sVar8;
      }
    }
    psVar7 = (sexp)(lVar12 * 2 + 1);
    goto LAB_0011bd88;
  }
  local_30.var = &local_38;
  psVar7 = sexp_xtype_exception(ctx,(sexp)0x0,msg,b);
LAB_0011bd88:
  (ctx->value).context.saves = local_30.next;
  return psVar7;
}

Assistant:

sexp sexp_compare (sexp ctx, sexp a, sexp b) {
  int at=sexp_number_type(a), bt=sexp_number_type(b);
  sexp r=SEXP_VOID;
  double f, g;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  if (at > bt) {
    r = sexp_compare(ctx, b, a);
    if (!sexp_exceptionp(r)) { sexp_negate(r); }
  } else {
    switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
    case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
    case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_COMPLEX
    case SEXP_NUM_CPX_CPX: case SEXP_NUM_FIX_CPX:
    case SEXP_NUM_FLO_CPX: case SEXP_NUM_BIG_CPX:
#if SEXP_USE_RATIOS
    case SEXP_NUM_RAT_CPX:
#endif
#endif
      r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
      break;
    case SEXP_NUM_FIX_FIX:
      r = sexp_make_fixnum(sexp_unbox_fixnum(a) - sexp_unbox_fixnum(b));
      break;
    case SEXP_NUM_FIX_FLO:
      if (isinf(sexp_flonum_value(b))) {
        r = sexp_flonum_value(b) > 0 ? SEXP_NEG_ONE : SEXP_ONE;
      } else if (isnan(sexp_flonum_value(b))) {
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", b);
      } else {
        r = sexp_compare(ctx, a, tmp=sexp_inexact_to_exact(ctx, NULL, 1, b));
      }
      break;
    case SEXP_NUM_FIX_BIG:
      if ((sexp_bignum_hi(b) > 1) ||
          (sexp_bignum_data(b)[0] > SEXP_MAX_FIXNUM))
        r = sexp_make_fixnum(sexp_bignum_sign(b) < 0 ? 1 : -1);
      else
        r = sexp_make_fixnum(sexp_unbox_fixnum(a) - (sexp_sint_t)sexp_bignum_data(b)[0]);
      break;
    case SEXP_NUM_FLO_FLO:
      f = sexp_flonum_value(a);
      g = sexp_flonum_value(b);
      if (isnan(f))
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", a);
      else if (isnan(g))
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", b);
      else
        r = sexp_make_fixnum(f < g ? -1 : f == g ? 0 : 1);
      break;
    case SEXP_NUM_FLO_BIG:
      f = sexp_flonum_value(a);
      if (isinf(f)) {
        r = f > 0 ? SEXP_ONE : SEXP_NEG_ONE;
        break;
      } else if (isnan(f)) {
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", a);
        break;
      } else {
        a = tmp = sexp_double_to_bignum(ctx, f);
      }
      /* ... FALLTHROUGH ... */
    case SEXP_NUM_BIG_BIG:
      r = sexp_make_fixnum(sexp_bignum_compare(a, b));
      break;
#if SEXP_USE_RATIOS
    case SEXP_NUM_FLO_RAT:
      f = sexp_flonum_value(a);
      if (isinf(f)) {
        r = f > 0 ? SEXP_ONE : SEXP_NEG_ONE;
      } else if (isnan(f)) {
        r = sexp_xtype_exception(ctx, NULL, "can't compare NaN", a);
      } else {
        r = sexp_compare(ctx, tmp=sexp_inexact_to_exact(ctx, NULL, 1, a), b);
      }
      break;
    case SEXP_NUM_FIX_RAT:
    case SEXP_NUM_BIG_RAT:
      a = tmp = sexp_make_ratio(ctx, a, SEXP_ONE);
      /* ... FALLTHROUGH ... */
    case SEXP_NUM_RAT_RAT:
      r = sexp_ratio_compare(ctx, a, b);
      break;
#endif
    default:
      r = sexp_xtype_exception(ctx, NULL, "unknown comparison", a);
      break;
    }
  }
  sexp_gc_release1(ctx);
  return r;
}